

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Clara::CommandLine<Catch::ConfigData>::Arg::Arg(Arg *this,Arg *param_1)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*((param_1->boundField).functionObj)->_vptr_IArgFunction[5])();
  (this->boundField).functionObj = (IArgFunction<Catch::ConfigData> *)CONCAT44(extraout_var,iVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->shortNames,&param_1->shortNames);
  (this->longName)._M_dataplus._M_p = (pointer)&(this->longName).field_2;
  pcVar1 = (param_1->longName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->longName,pcVar1,pcVar1 + (param_1->longName)._M_string_length);
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (param_1->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + (param_1->description)._M_string_length);
  (this->hint)._M_dataplus._M_p = (pointer)&(this->hint).field_2;
  pcVar1 = (param_1->hint)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->hint,pcVar1,pcVar1 + (param_1->hint)._M_string_length);
  this->position = param_1->position;
  return;
}

Assistant:

bool hasShortName( std::string const& shortName ) const {
                for(    std::vector<std::string>::const_iterator
                            it = shortNames.begin(), itEnd = shortNames.end();
                        it != itEnd;
                        ++it )
                    if( *it == shortName )
                        return true;
                return false;
            }